

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::SeparateProgramsVertex::Run(SeparateProgramsVertex *this)

{
  char *pcVar1;
  uint program;
  uint uVar2;
  mapped_type *pmVar3;
  allocator<char> local_659;
  key_type local_658;
  undefined8 uStack_638;
  GLint expected3 [6];
  undefined8 uStack_618;
  GLenum props3 [6];
  key_type local_5f8;
  undefined8 local_5d8;
  GLint expected2 [7];
  GLenum props2 [7];
  undefined4 local_578;
  undefined4 local_574;
  GLint expected [13];
  undefined8 uStack_538;
  GLenum props [13];
  allocator<char> local_4f9;
  string local_4f8 [39];
  allocator<char> local_4d1;
  string local_4d0 [39];
  allocator<char> local_4a9;
  string local_4a8 [39];
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  key_type local_458;
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  key_type local_408;
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  key_type local_3b8;
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  key_type local_368;
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  key_type local_318;
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  key_type local_2c8;
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  key_type local_278;
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  key_type local_228;
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [55];
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  char *pcStack_20;
  GLuint vs;
  char *srcVS;
  long error;
  SeparateProgramsVertex *this_local;
  
  srcVS = (char *)0x0;
  pcStack_20 = 
  "#version 310 es                            \nlayout(location = 0) in vec4 in_vertex;    \nout mediump float r, g, b;                           \nout mediump vec4 iLikePie;                           \nuniform mediump float u;                           \nuniform mediump vec4 v;                            \nvoid main() {                     \n  gl_Position = in_vertex;        \n  r = u;                          \n  g = 0.0;                        \n  b = 0.0;                        \n  iLikePie = v;                   \n}"
  ;
  error = (long)this;
  program = (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[0x17])(this,0x8b31,1,&stack0xffffffffffffffe0);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e1,0x92f5,2,&srcVS);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f6,10,&srcVS);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e3,0x92f5,1,&srcVS);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f6,0xc,&srcVS);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e4,0x92f5,5,&srcVS);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"u",&local_d9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,local_d8,
    &srcVS);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_110,"v",&local_111);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,local_110,
    &srcVS);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"in_vertex",&local_139);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,local_138,
    &srcVS);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"r",&local_161);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,local_b8,local_160,&srcVS);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"g",&local_189);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,local_b8,local_188,&srcVS);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"b",&local_1b1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,local_b8,local_1b0,&srcVS);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"iLikePie",&local_1d9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,local_b8,local_1d8,&srcVS);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"gl_Position",&local_201);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e4,local_b8,local_200,&srcVS);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"u",&local_229);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_228);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"u",&local_251);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar2,local_250,&srcVS);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"v",&local_279);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_278);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"v",&local_2a1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar2,local_2a0,&srcVS);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"in_vertex",&local_2c9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2c8);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"in_vertex",&local_2f1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e3,(ulong)uVar2,local_2f0,&srcVS);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"r",&local_319);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_318);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"r",&local_341);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar2,local_340,&srcVS);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"g",&local_369);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_368);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_390,"g",&local_391);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar2,local_390,&srcVS);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"b",&local_3b9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_3b8);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"b",&local_3e1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar2,local_3e0,&srcVS);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"iLikePie",&local_409);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_408);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_430,"iLikePie",&local_431);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar2,local_430,&srcVS);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"gl_Position",&local_459);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_458);
  uVar2 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"gl_Position",&local_481);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e4,(ulong)uVar2,local_480,&srcVS);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a8,"u",&local_4a9);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program,"u");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_4a8,(ulong)uVar2,&srcVS);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d0,"v",&local_4d1);
  uVar2 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program,"v");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,local_4d0,(ulong)uVar2,&srcVS);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"in_vertex",&local_4f9);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e3,local_4f8,0,&srcVS);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  props[6] = 0x9301;
  props[7] = 0x930b;
  props[8] = 0x930a;
  props[9] = 0x9306;
  props[2] = 0x92fd;
  props[3] = 0x92fe;
  props[4] = 0x92ff;
  props[5] = 0x9300;
  uStack_538 = 0x92fa000092f9;
  props[0] = 0x92fb;
  props[1] = 0x92fc;
  props[10] = 0x930e;
  local_578 = 2;
  local_574 = 0x8b52;
  expected[0] = 1;
  expected[1] = -1;
  expected[2] = -1;
  expected[3] = -1;
  expected[4] = -1;
  expected[5] = 0;
  expected[6] = -1;
  expected[7] = 0;
  expected[8] = 0;
  expected[9] = 1;
  expected[10] = glu::CallLogWrapper::glGetUniformLocation
                           (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,program,"v");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(props2 + 6),"v",(allocator<char> *)((long)props2 + 0x17));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)(props2 + 6));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e1,(ulong)*pmVar3,0xd,&uStack_538,0xd,&local_578,&srcVS);
  std::__cxx11::string::~string((string *)(props2 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)props2 + 0x17));
  props2[2] = 0x930a;
  props2[3] = 0x9306;
  props2[4] = 0x930e;
  stack0xfffffffffffffa48 = 0x92fa000092f9;
  props2[0] = 0x92fb;
  props2[1] = 0x930b;
  expected2[2] = 0;
  expected2[3] = 1;
  expected2[4] = 0;
  local_5d8 = 0x8b520000000a;
  expected2[0] = 1;
  expected2[1] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"in_vertex",(allocator<char> *)((long)props3 + 0x17));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5f8);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e3,(ulong)*pmVar3,7,expected2 + 6,7,&local_5d8,&srcVS);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)props3 + 0x17));
  props3[2] = 0x930a;
  props3[3] = 0x9306;
  uStack_618 = 0x92fa000092f9;
  props3[0] = 0x92fb;
  props3[1] = 0x930b;
  expected3[2] = 0;
  expected3[3] = 1;
  uStack_638 = 0x8b5200000009;
  expected3[0] = 1;
  expected3[1] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"iLikePie",&local_659);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_b8,&local_658);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,(ulong)*pmVar3,6,&uStack_618,6,&uStack_638,&srcVS);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,program);
  pcVar1 = srcVS;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (long)pcVar1;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcVS = "#version 310 es                            \n"
							"layout(location = 0) in vec4 in_vertex;    \n"
							""
							"out mediump float r, g, b;                           \n"
							"out mediump vec4 iLikePie;                           \n"
							""
							"uniform mediump float u;                           \n"
							"uniform mediump vec4 v;                            \n"
							""
							"void main() {                     \n"
							"  gl_Position = in_vertex;        \n"
							"  r = u;                          \n"
							"  g = 0.0;                        \n"
							"  b = 0.0;                        \n"
							"  iLikePie = v;                   \n"
							"}";

		const GLuint vs = CreateShaderProgram(GL_VERTEX_SHADER, 1, &srcVS);

		VerifyGetProgramInterfaceiv(vs, GL_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(vs, GL_UNIFORM, GL_ACTIVE_RESOURCES, 2, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 10, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 12, error);
		VerifyGetProgramInterfaceiv(vs, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 5, error);

		std::map<std::string, GLuint> indicesU;
		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		VerifyGetProgramResourceIndex(vs, GL_UNIFORM, indicesU, "u", error);
		VerifyGetProgramResourceIndex(vs, GL_UNIFORM, indicesU, "v", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_INPUT, indicesI, "in_vertex", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "r", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "g", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "b", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "iLikePie", error);
		VerifyGetProgramResourceIndex(vs, GL_PROGRAM_OUTPUT, indicesO, "gl_Position", error);

		VerifyGetProgramResourceName(vs, GL_UNIFORM, indicesU["u"], "u", error);
		VerifyGetProgramResourceName(vs, GL_UNIFORM, indicesU["v"], "v", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_INPUT, indicesI["in_vertex"], "in_vertex", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["r"], "r", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["g"], "g", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["b"], "b", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["iLikePie"], "iLikePie", error);
		VerifyGetProgramResourceName(vs, GL_PROGRAM_OUTPUT, indicesO["gl_Position"], "gl_Position", error);

		VerifyGetProgramResourceLocation(vs, GL_UNIFORM, "u", glGetUniformLocation(vs, "u"), error);
		VerifyGetProgramResourceLocation(vs, GL_UNIFORM, "v", glGetUniformLocation(vs, "v"), error);
		VerifyGetProgramResourceLocation(vs, GL_PROGRAM_INPUT, "in_vertex", 0, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 2, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 0, 1, glGetUniformLocation(vs, "v") };
		VerifyGetProgramResourceiv(vs, GL_UNIFORM, indicesU["v"], 13, props, 13, expected, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION };
		GLint expected2[] = { 10, 35666, 1, 0, 0, 1, 0 };
		VerifyGetProgramResourceiv(vs, GL_PROGRAM_INPUT, indicesI["in_vertex"], 7, props2, 7, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER };
		GLint expected3[] = { 9, 35666, 1, 0, 0, 1 };
		VerifyGetProgramResourceiv(vs, GL_PROGRAM_OUTPUT, indicesO["iLikePie"], 6, props3, 6, expected3, error);

		glDeleteProgram(vs);
		return error;
	}